

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdFetchSseImmediate(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                            ND_UINT8 SseImmSize)

{
  byte bVar1;
  NDSTATUS NVar2;
  undefined3 in_register_00000011;
  
  NVar2 = 0x80000001;
  if (CONCAT31(in_register_00000011,Offset) < Size) {
    Instrux->field_0x7 = Instrux->field_0x7 | 0x10;
    *(ushort *)&Instrux->field_0x14 =
         (ushort)*(undefined4 *)&Instrux->field_0x14 & 0xf0ff | (ushort)(Offset & 0xf) << 8;
    Instrux->field_76 =
         *(anon_union_1_2_a701ec8c_for__INSTRUX_91 *)(Code + CONCAT31(in_register_00000011,Offset));
    bVar1 = Instrux->Length + 1;
    Instrux->Length = bVar1;
    NVar2 = 0x80000003;
    if (bVar1 < 0x10) {
      NVar2 = 0;
    }
  }
  return NVar2;
}

Assistant:

static NDSTATUS
NdFetchSseImmediate(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 SseImmSize
    )
{
    RET_GT((ND_SIZET)Offset + SseImmSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasSseImm = ND_TRUE;
    Instrux->SseImmOffset = Offset;
    Instrux->SseImmediate = *(Code + Offset);

    Instrux->Length += SseImmSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}